

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::GridAxisIrregular::AddXiValue(GridAxisIrregular *this,KUINT16 Xi)

{
  KUINT16 local_a;
  
  local_a = Xi;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
            (&this->m_vXiValues,&local_a);
  (this->super_GridAxisRegular).m_ui16NumPoints =
       (KUINT16)((uint)(*(int *)&(this->m_vXiValues).
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                       *(int *)&(this->m_vXiValues).
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 1);
  calculatePadding(this);
  return;
}

Assistant:

void GridAxisIrregular::AddXiValue( KUINT16 Xi )
{
    m_vXiValues.push_back( Xi );
    m_ui16NumPoints = m_vXiValues.size();
    calculatePadding();
}